

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall
client_socket::client_socket
          (client_socket *this,epoll *ep,file_descriptor *fd,on_ready_t *on_disconnect)

{
  function<void_()> local_90;
  function<void_()> local_70;
  function<void_()> local_50;
  file_descriptor local_2c;
  on_ready_t *local_28;
  on_ready_t *on_disconnect_local;
  file_descriptor *fd_local;
  epoll *ep_local;
  client_socket *this_local;
  
  local_28 = on_disconnect;
  on_disconnect_local = (on_ready_t *)fd;
  fd_local = &ep->fd_;
  ep_local = (epoll *)this;
  file_descriptor::file_descriptor(&local_2c,fd);
  std::function<void_()>::function(&local_50,on_disconnect);
  std::function<void_()>::function(&local_70);
  std::function<void_()>::function(&local_90);
  client_socket(this,ep,&local_2c,&local_50,&local_70,&local_90);
  std::function<void_()>::~function(&local_90);
  std::function<void_()>::~function(&local_70);
  std::function<void_()>::~function(&local_50);
  file_descriptor::~file_descriptor(&local_2c);
  return;
}

Assistant:

client_socket::client_socket(sysapi::epoll &ep, file_descriptor fd, on_ready_t on_disconnect)
    : client_socket(ep, std::move(fd), std::move(on_disconnect), on_ready_t{}, on_ready_t{})
{}